

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O2

void lts2::BinaryReconstructionWithBIHT
               (Mat *X,LBDOperator *LBD,Mat *binaryDescriptor,int iterations,float sparsityCoeff,
               Size *patchSize,float patchMean,int norm,string *wavelet)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  _InputArray *p_Var4;
  ostream *poVar5;
  _InputArray *p_Var6;
  _InputArray *p_Var7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  float fVar15;
  double dVar16;
  undefined8 uVar17;
  int wh;
  int ww;
  int fsize;
  double *Q;
  double *P;
  _InputArray *local_298;
  int local_290;
  int local_28c;
  _InputArray local_288;
  int local_270;
  float local_26c;
  double local_268;
  double local_260;
  _InputArray *local_258;
  Size local_250;
  _InputArray *local_200;
  _OutputArray local_1f8;
  double local_1e0;
  SignOperator A;
  _InputArray local_1c8 [2];
  undefined8 *local_188;
  long *local_180;
  Mat X_im;
  Size local_108;
  Size local_100;
  int local_f8;
  int local_f4;
  Mat nablaJ;
  Mat C0;
  
  local_28c = norm;
  local_270 = iterations;
  local_26c = patchMean;
  if ((norm != 2) && (norm != 4)) {
LAB_001085ec:
    std::__cxx11::string::string
              ((string *)&X_im,"norm == cv::NORM_L1 || norm == cv::NORM_L2",(allocator *)local_1c8);
    uVar17 = cv::error(-0xd7,(string *)&X_im,"BinaryReconstructionWithBIHT",
                       "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                       ,0x167);
    SignOperator::~SignOperator(&A);
    cv::Mat::~Mat(&C0);
    cv::Mat::~Mat(&nablaJ);
    cv::Mat::~Mat((Mat *)local_1c8);
    cv::Mat::~Mat(&X_im);
    _Unwind_Resume(uVar17);
  }
  local_290 = *(int *)(binaryDescriptor + 0xc);
  if (*(int *)(binaryDescriptor + 0xc) < *(int *)(binaryDescriptor + 8)) {
    local_290 = *(int *)(binaryDescriptor + 8);
  }
  dVar16 = 1.0;
  if ((double)sparsityCoeff <= 1.0) {
    dVar16 = (double)sparsityCoeff;
  }
  iVar14 = patchSize->width;
  iVar3 = patchSize->height;
  local_200 = (_InputArray *)binaryDescriptor;
  fVar15 = rintf((float)(iVar3 * iVar14) * (float)(double)(~-(ulong)(dVar16 <= 0.0) & (ulong)dVar16)
                );
  local_268 = (double)CONCAT44(local_268._4_4_,fVar15);
  local_f8 = iVar14;
  local_f4 = iVar3;
  cv::Mat::create(X,&local_f8,5);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&X_im,0.0);
  local_1c8[0].flags = 0xc1020006;
  local_1c8[0].sz.width = 1;
  local_1c8[0].sz.height = 4;
  local_1c8[0].obj = &X_im;
  cv::noArray();
  local_298 = (_InputArray *)X;
  cv::Mat::setTo((_InputArray *)X,local_1c8);
  cv::Mat::Mat(&X_im);
  cv::Mat::Mat((Mat *)local_1c8);
  cv::Mat::Mat(&nablaJ);
  P = (double *)0x0;
  Q = (double *)0x0;
  fsize = 0;
  WaveletCoef(wavelet,&P,&Q,&fsize);
  local_100 = *patchSize;
  cv::Mat::create(&X_im,&local_100,5);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&C0,(double)local_26c);
  local_260 = (double)CONCAT44(local_260._4_4_,0xc1020006);
  local_250.width = 1;
  local_250.height = 4;
  local_258 = (_InputArray *)&C0;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&X_im,(_InputArray *)&local_260);
  WaveletTransform2D(&X_im,(Mat *)local_298,P,Q,fsize,&ww,&wh,-1);
  local_288.flags = 0;
  local_288._4_4_ = 0;
  cv::Mat::Mat((Mat *)&local_260,(Mat *)local_298,(Rect_ *)&local_288);
  cv::Mat::clone();
  p_Var6 = local_200;
  cv::Mat::~Mat((Mat *)&local_260);
  InverseWaveletTransform2D((Mat *)local_298,&X_im,P,Q,fsize,&ww,&wh);
  SignOperator::SignOperator(&A);
  local_108 = *patchSize;
  cv::Mat::create(local_298,&local_108,5);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&local_260,0.0);
  local_288.flags = -0x3efdfffa;
  local_288.sz.width = 1;
  local_288.sz.height = 4;
  local_288.obj = (Mat *)&local_260;
  cv::noArray();
  p_Var7 = local_298;
  uVar17 = 0x107ff7;
  cv::Mat::setTo(local_298,&local_288);
  if (local_28c == 4) {
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,p_Var6,&X_im);
    WaveletTransform2D(&X_im,(Mat *)local_298,P,Q,fsize,&ww,&wh,-1);
    p_Var7 = local_298;
    local_250.width = 0;
    local_250.height = 0;
    local_260 = (double)CONCAT44(local_260._4_4_,0x1010000);
    local_258 = local_298;
    p_Var4 = (_InputArray *)cv::noArray();
    uVar17 = 0x108074;
    dVar16 = (double)cv::norm((_InputArray *)&local_260,4,p_Var4);
    if (0.0 < (float)dVar16) {
      local_260 = (double)(float)dVar16;
      uVar17 = 0x108095;
      cv::operator/=((Mat *)p_Var7,&local_260);
    }
  }
  fVar15 = (float)local_290;
  local_290 = (int)local_268._0_4_;
  local_1e0 = (double)(1.0 / fVar15);
  local_268 = local_1e0 * 0.5;
  bVar2 = false;
  iVar14 = 0;
  do {
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Stopped after ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar14);
      poVar5 = std::operator<<(poVar5," iterations ");
      poVar5 = std::operator<<(poVar5," (max allowed was ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_270);
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
      local_250.width = 0;
      local_250.height = 0;
      local_260._0_4_ = 0x1010000;
      local_258 = p_Var7;
      p_Var6 = (_InputArray *)cv::noArray();
      cv::norm((_InputArray *)&local_260,4,p_Var6);
      InverseWaveletTransform2D((Mat *)p_Var7,&X_im,P,Q,fsize,&ww,&wh);
      local_250.width = 0;
      local_250.height = 0;
      local_288.sz.width = 0;
      local_288.sz.height = 0;
      local_260 = (double)CONCAT44(local_260._4_4_,0x1010000);
      local_288.flags = 0x3010000;
      local_288.obj = p_Var7;
      local_258 = (_InputArray *)&X_im;
      p_Var7 = (_InputArray *)cv::noArray();
      cv::normalize((_InputArray *)&local_260,(_InputOutputArray *)&local_288,0.0,1.0,0x20,-1,p_Var7
                   );
      if (P != (double *)0x0) {
        operator_delete__(P);
      }
      if (Q != (double *)0x0) {
        operator_delete__(Q);
      }
      SignOperator::~SignOperator(&A);
      cv::Mat::~Mat(&C0);
      cv::Mat::~Mat(&nablaJ);
      cv::Mat::~Mat((Mat *)local_1c8);
      cv::Mat::~Mat(&X_im);
      return;
    }
    InverseWaveletTransform2D((Mat *)p_Var7,&X_im,P,Q,fsize,&ww,&wh);
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[2])(LBD,&X_im,local_1c8,uVar17);
    if (local_28c == 2) {
      cv::operator-=((Mat *)local_1c8,(Mat *)p_Var6);
      (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,local_1c8,&X_im);
      WaveletTransform2D(&X_im,&nablaJ,P,Q,fsize,&ww,&wh,-1);
      local_260 = local_268;
      cv::operator*=(&nablaJ,&local_260);
    }
    else {
      local_250.width = 0;
      local_250.height = 0;
      local_260 = (double)CONCAT44(local_260._4_4_,0x1010000);
      local_288.sz.width = 0;
      local_288.sz.height = 0;
      local_1f8.super__InputArray.sz.width = 0;
      local_1f8.super__InputArray.sz.height = 0;
      local_288.flags = 0x1010000;
      local_1f8.super__InputArray.flags = 0x2010000;
      local_288.obj = p_Var6;
      local_258 = local_1c8;
      local_1f8.super__InputArray.obj = local_1c8;
      cv::multiply((_InputArray *)&local_260,&local_288,&local_1f8,1.0,-1);
      if ((local_1c8[0].flags & 0xfffU) != 5) {
        std::__cxx11::string::string
                  ((string *)&local_260,"src.type() == CV_32F",(allocator *)&local_288);
        cv::error(-0xd7,(string *)&local_260,"ExtractTheNegativePart",
                  "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                  ,0x67);
        goto LAB_001085ec;
      }
      local_260._4_4_ = (undefined4)*local_188;
      local_260._0_4_ = (int)((ulong)*local_188 >> 0x20);
      cv::Mat::create(local_1c8,&local_260,5);
      p_Var6 = local_200;
      uVar1 = (uint)local_1c8[0].obj;
      iVar3 = local_1c8[0].obj._4_4_;
      uVar9 = (uint)local_1c8[0].obj;
      if (((uint)local_1c8[0].flags >> 0xe & 1) != 0) {
        iVar3 = local_1c8[0].obj._4_4_ * (uint)local_1c8[0].obj * (uint)local_1c8[0].obj;
        local_1c8[0].obj = (void *)CONCAT44(iVar3,1);
        uVar9 = 1;
      }
      iVar11 = 0;
      if (0 < iVar3) {
        iVar11 = iVar3;
      }
      uVar10 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar10 = 0;
      }
      for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        lVar13 = *local_180 * uVar12 + (long)local_1c8[0].sz;
        for (lVar8 = 0; iVar11 != (int)lVar8; lVar8 = lVar8 + 1) {
          *(uint *)(lVar13 + lVar8 * 4) = -(uint)(*(float *)(lVar13 + lVar8 * 4) < 0.0) & 0xbf800000
          ;
        }
      }
      if (((uint)local_1c8[0].flags >> 0xe & 1) != 0) {
        local_1c8[0].obj = (void *)CONCAT44((iVar3 / (int)uVar1) / (int)uVar1,uVar1);
      }
      local_250.width = 0;
      local_250.height = 0;
      local_260 = (double)CONCAT44(local_260._4_4_,0x1010000);
      local_288.sz.width = 0;
      local_288.sz.height = 0;
      local_1f8.super__InputArray.sz.width = 0;
      local_1f8.super__InputArray.sz.height = 0;
      local_288.flags = 0x1010000;
      local_288.obj = local_200;
      local_1f8.super__InputArray.flags = 0x2010000;
      local_258 = local_1c8;
      local_1f8.super__InputArray.obj = local_1c8;
      cv::multiply((_InputArray *)&local_260,&local_288,&local_1f8,1.0,-1);
      (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,local_1c8,&X_im);
      p_Var7 = local_298;
      WaveletTransform2D(&X_im,&nablaJ,P,Q,fsize,&ww,&wh,-1);
      local_260 = local_1e0;
      cv::operator*=(&nablaJ,&local_260);
    }
    cv::operator-=((Mat *)p_Var7,&nablaJ);
    ProxL0((Mat *)p_Var7,local_290);
    InverseWaveletTransform2D((Mat *)p_Var7,&X_im,P,Q,fsize,&ww,&wh);
    ProxRangeConstraint(&X_im,0.0,1.0);
    uVar17 = 0x10842c;
    ProxMeanConstraint(&X_im,local_26c);
    iVar14 = iVar14 + 1;
    bVar2 = local_270 <= iVar14;
  } while( true );
}

Assistant:

void lts2::BinaryReconstructionWithBIHT(cv::Mat &X, LBDOperator &LBD, cv::Mat const &binaryDescriptor,
                                        int iterations, float sparsityCoeff, cv::Size patchSize, float patchMean,
                                        int norm, std::string const &wavelet)
{
  CV_Assert(norm == cv::NORM_L1 || norm == cv::NORM_L2);

  int const M = MAX(binaryDescriptor.rows, binaryDescriptor.cols);
  float const tau = 1.0 / (float)M;

  sparsityCoeff = MAX(MIN(sparsityCoeff, 1.0), 0.0);
  int const K = (int)rintf( sparsityCoeff*patchSize.area() );

  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));

  cv::Mat X_im;
  cv::Mat Ax;
  cv::Mat nablaJ;

  // Wavelet basis
  double *P = NULL, *Q = NULL;
  int fsize = 0, ww, wh;
  lts2::WaveletCoef(wavelet, &P, &Q, &fsize);

  X_im.create(patchSize, CV_32F);
  X_im.setTo(cv::Scalar(patchMean));
  lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
  cv::Mat C0 = X(cv::Rect(0,0,ww,wh)).clone();
  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);

  // Operators
  SignOperator A;

  // Special init if norm = L2
  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));
  if (norm == cv::NORM_L2)
  {
    LBD.ApplyConjugate(binaryDescriptor, X_im);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
    float norm_x = cv::norm(X);
    if (norm_x > 0.0) X /= norm_x;
  }

  bool hasConverged = false;
  int iter = 0;

  while (!hasConverged)
  {
    // Back from the wavelet world
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    LBD.Apply(X_im, Ax);

    // Step 1a : gradient
    if (norm == cv::NORM_L1)
    {
      Ax -= binaryDescriptor;

      LBD.ApplyConjugate(Ax, X_im);
      lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);
      nablaJ *= (0.5*tau);
    }
    else
    {
      cv::multiply(Ax, binaryDescriptor, Ax);
      ExtractTheNegativePart(Ax, Ax);

      cv::multiply(Ax, binaryDescriptor, Ax);
      LBD.ApplyConjugate(Ax, X_im);
      lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);

      nablaJ *= tau;
    }

    // Step 1b : update estimate
    X -= nablaJ;

    // Step 2 : enforce sparsity
    lts2::ProxL0(X, K);
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    lts2::ProxRangeConstraint(X_im, 0.0, 1.0);
    lts2::ProxMeanConstraint(X_im, patchMean);

    // Termination criterion
    hasConverged = (++iter >= iterations);  // Iterations count limit
  }

#ifdef DEBUG
  std::cout << "Stopped after " << iter << " iterations " << " (max allowed was " << iterations << ")" << std::endl;
#endif

  // Normalize by projecting to the sphere
  float norm_x = cv::norm(X);
//  if (norm_x < LTS2_EPSILON)
//    norm_x = 1.0
//  X /= norm_x;

  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
  cv::normalize(X_im, X, 0.0, 1.0, cv::NORM_MINMAX);

  // Cleanup
  delete[] P;
  delete[] Q;
}